

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O3

bool google::protobuf::util::anon_unknown_0::CheckFieldTypeUrl
               (Type *type,string_view name,string_view type_url)

{
  bool bVar1;
  int iVar2;
  Field *pFVar3;
  undefined8 *puVar4;
  string_view name_00;
  
  name_00._M_str = (char *)type_url._M_len;
  name_00._M_len = name._M_str;
  pFVar3 = FindField((anon_unknown_0 *)type,(Type *)name._M_len,name_00);
  if ((pFVar3 == (Field *)0x0) ||
     (puVar4 = (undefined8 *)
               ((ulong)(pFVar3->field_0)._impl_.type_url_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
     (char *)puVar4[1] != name_00._M_str)) {
LAB_00bb3ef4:
    bVar1 = false;
  }
  else {
    if (name_00._M_str != (char *)0x0) {
      iVar2 = bcmp((void *)*puVar4,type_url._M_str,(size_t)name_00._M_str);
      if (iVar2 != 0) goto LAB_00bb3ef4;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool CheckFieldTypeUrl(const Type& type, absl::string_view name,
                       absl::string_view type_url) {
  const Field* field = FindField(type, name);
  if (field == nullptr) {
    return false;
  }
  return field->type_url() == type_url;
}